

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

double3 * tinyusdz::transform(double3 *__return_storage_ptr__,matrix4d *m,double3 *p)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  array<double,_3UL> *in_RCX;
  array<double,_3UL> local_28;
  
  dVar1 = m->m[3][2];
  dVar4 = m->m[3][0];
  dVar3 = m->m[3][1];
  value::MultV<tinyusdz::value::matrix4d,std::array<double,3ul>,double,double,3ul>
            (&local_28,(value *)m,(matrix4d *)p,in_RCX);
  dVar3 = dVar3 + local_28._M_elems[1];
  auVar2._8_4_ = SUB84(dVar3,0);
  auVar2._0_8_ = dVar4 + local_28._M_elems[0];
  auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
  *(undefined1 (*) [16])__return_storage_ptr__->_M_elems = auVar2;
  __return_storage_ptr__->_M_elems[2] = dVar1 + local_28._M_elems[2];
  return __return_storage_ptr__;
}

Assistant:

value::double3 transform(const value::matrix4d &m, const value::double3 &p) {
  value::double3 tx{m.m[3][0], m.m[3][1], m.m[3][2]};
  return value::MultV<value::matrix4d, value::double3, double, double, 3>(m, p) + tx;
}